

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O2

int32 __thiscall DynamicProfileStorageReaderWriter::Size(DynamicProfileStorageReaderWriter *this)

{
  code *pcVar1;
  bool bVar2;
  LONG lOffset;
  LONG LVar3;
  undefined4 *puVar4;
  PAL_FILE *f;
  
  f = this->file;
  if (f == (PAL_FILE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0xc0,"(file)","file");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    f = this->file;
  }
  lOffset = PAL_ftell(f);
  SeekToEnd(this);
  LVar3 = PAL_ftell(this->file);
  PAL_fseek(this->file,lOffset,0);
  return LVar3;
}

Assistant:

int32 DynamicProfileStorageReaderWriter::Size()
{
    AssertOrFailFast(file);
    int32 current = ftell(file);
    SeekToEnd();
    int32 end = ftell(file);
    fseek(file, current, SEEK_SET);
    return end;
}